

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::SetCV(ON_NurbsCurve *this,int i,ON_3dPoint *point)

{
  double *pdVar1;
  double *cv;
  bool rc;
  ON_3dPoint *point_local;
  int i_local;
  ON_NurbsCurve *this_local;
  
  cv._7_1_ = false;
  pdVar1 = CV(this,i);
  if (pdVar1 != (double *)0x0) {
    *pdVar1 = point->x;
    if (1 < this->m_dim) {
      pdVar1[1] = point->y;
      if (2 < this->m_dim) {
        pdVar1[2] = point->z;
      }
      if (3 < this->m_dim) {
        memset(pdVar1 + 3,0,(long)(this->m_dim + -3) << 3);
      }
    }
    if (this->m_is_rat != 0) {
      pdVar1[this->m_dim] = 1.0;
    }
    cv._7_1_ = true;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return cv._7_1_;
}

Assistant:

bool 
ON_NurbsCurve::SetCV( int i, const ON_3dPoint& point )
{
  bool rc = false;
  double* cv = CV(i);
  if ( cv ) {
    cv[0] = point.x;
    if ( m_dim > 1 ) {
      cv[1] = point.y;
      if ( m_dim > 2 )
        cv[2] = point.z;
      if ( m_dim > 3 ) {
        memset( &cv[3], 0, (m_dim-3)*sizeof(*cv) );
      }
    }
    if ( m_is_rat ) {
      cv[m_dim] = 1.0;
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}